

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubroutineSymbols.cpp
# Opt level: O2

MethodPrototypeSymbol *
slang::ast::MethodPrototypeSymbol::fromSyntax
          (ASTContext *context,ModportNamedPortSyntax *syntax,bool isExport)

{
  SubroutineSymbol *this;
  Compilation *this_00;
  MethodPrototypeSymbol *pMVar1;
  SubroutineSymbol **ppSVar2;
  undefined7 in_register_00000011;
  bool in_R9B;
  ArgList AVar3;
  span<const_slang::ast::FormalArgumentSymbol_*const,_18446744073709551615UL> sVar4;
  Token nameToken;
  
  nameToken.info = CONCAT71(in_register_00000011,isExport) & 0xffffffff;
  nameToken._0_8_ = (syntax->name).info;
  pMVar1 = createForModport((MethodPrototypeSymbol *)(context->scope).ptr,(Scope *)syntax,
                            *(SyntaxNode **)&syntax->name,nameToken,in_R9B);
  ppSVar2 = std::optional<const_slang::ast::SubroutineSymbol_*>::value(&pMVar1->subroutine);
  this = *ppSVar2;
  if (this != (SubroutineSymbol *)0x0) {
    DeclaredType::setLink(&pMVar1->declaredReturnType,&this->declaredReturnType);
    pMVar1->subroutineKind = this->subroutineKind;
    this_00 = ((context->scope).ptr)->compilation;
    AVar3 = SubroutineSymbol::getArguments(this);
    sVar4._M_extent._M_extent_value = nameToken.info;
    sVar4._M_ptr = (pointer)AVar3._M_extent._M_extent_value._M_extent_value;
    sVar4 = cloneArguments((ast *)this_00,(Compilation *)&pMVar1->super_Scope,(Scope *)AVar3._M_ptr,
                           sVar4);
    pMVar1->arguments = sVar4;
  }
  return pMVar1;
}

Assistant:

MethodPrototypeSymbol& MethodPrototypeSymbol::fromSyntax(const ASTContext& context,
                                                         const ModportNamedPortSyntax& syntax,
                                                         bool isExport) {
    auto& result = createForModport(*context.scope, syntax, syntax.name, isExport);
    auto target = result.subroutine.value();
    if (!target)
        return result;

    result.declaredReturnType.setLink(target->declaredReturnType);
    result.subroutineKind = target->subroutineKind;
    result.arguments = cloneArguments(context.getCompilation(), result, target->getArguments());
    return result;
}